

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O1

int pkey_gost_mac_copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  int iVar9;
  
  iVar6 = pkey_gost_mac_init(dst);
  iVar9 = 0;
  if (iVar6 != 0) {
    puVar7 = (undefined8 *)EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)src);
    puVar8 = (undefined8 *)EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)dst);
    iVar9 = 0;
    if (puVar8 != (undefined8 *)0x0 && puVar7 != (undefined8 *)0x0) {
      uVar1 = *puVar7;
      uVar2 = puVar7[1];
      uVar3 = puVar7[2];
      uVar4 = puVar7[3];
      uVar5 = puVar7[5];
      puVar8[4] = puVar7[4];
      puVar8[5] = uVar5;
      puVar8[2] = uVar3;
      puVar8[3] = uVar4;
      *puVar8 = uVar1;
      puVar8[1] = uVar2;
      iVar9 = 1;
    }
  }
  return iVar9;
}

Assistant:

static int pkey_gost_mac_copy(EVP_PKEY_CTX *dst, ossl3_const EVP_PKEY_CTX *src)
{
    struct gost_mac_pmeth_data *dst_data, *src_data;
    if (!pkey_gost_mac_init(dst)) {
        return 0;
    }
    src_data = EVP_PKEY_CTX_get_data(src);
    dst_data = EVP_PKEY_CTX_get_data(dst);
    if (!src_data || !dst_data)
        return 0;

    *dst_data = *src_data;
    return 1;
}